

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::erase
          (pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *this,iterator _begin,iterator _end)

{
  undefined1 auVar1 [12];
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar2;
  ulong uVar3;
  int iVar4;
  ulong to_erase;
  ulong uVar5;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar6;
  unsigned_long uVar7;
  iterator _begin_00;
  iterator iter;
  iterator iter_00;
  iterator _end_00;
  iterator iVar8;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  local_40;
  
  pbVar6 = _end.node;
  pbVar2 = _begin.node;
  iVar4 = _begin.position;
  uVar7 = 0;
  local_40.node = pbVar2;
  local_40.position = iVar4;
  if (iVar4 != _end.position || pbVar2 != pbVar6) {
    do {
      do {
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
        ::increment(&local_40);
        uVar7 = uVar7 + 1;
      } while (local_40.node != pbVar6);
    } while (local_40.position != _end.position);
  }
  if (-1 < (long)uVar7) {
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      uVar5 = this->size_ - uVar7;
      if (uVar5 == 0) {
        if (this->size_ != 0) {
          internal_clear(this,(this->root_).
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
                              ._M_head_impl);
        }
        (this->root_).
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)&btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
                 ::EmptyNode()::empty_node;
        this->rightmost_ =
             (node_type *)
             &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
              ::EmptyNode()::empty_node;
        this->size_ = 0;
        iVar8 = end(this);
        pbVar2 = iVar8.node;
        iVar4 = iVar8.position;
      }
      else if (pbVar2 == pbVar6) {
        auVar1 = _begin._0_12_;
        iVar8._12_4_ = 0;
        iVar8.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      *)auVar1._0_8_;
        iVar8.position = auVar1._8_4_;
        _end_00._12_4_ = 0;
        _end_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                        *)SUB128(_end._0_12_,0);
        _end_00.position = SUB124(_end._0_12_,8);
        erase_same_node(this,iVar8,_end_00);
        this->size_ = this->size_ - uVar7;
        iter_00._12_4_ = 0;
        iter_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                        *)auVar1._0_8_;
        iter_00.position = auVar1._8_4_;
        iVar8 = rebalance_after_delete(this,iter_00);
        pbVar2 = iVar8.node;
        iVar4 = iVar8.position;
      }
      else {
        while (uVar5 < this->size_) {
          if (((ulong)pbVar2 & 7) != 0) {
            __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                          ,0xf84,
                          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                         );
          }
          if (pbVar2[0xb] ==
              (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
               )0x0) {
            iter.position = iVar4;
            iter.node = pbVar2;
            iter._12_4_ = 0;
            iVar8 = erase(this,iter);
            auVar1 = iVar8._0_12_;
          }
          else {
            uVar3 = this->size_ - uVar5;
            _begin_00._8_8_ = (long)iVar4;
            to_erase = (ulong)(byte)pbVar2[10] - _begin_00._8_8_;
            if (uVar3 < (ulong)(byte)pbVar2[10] - _begin_00._8_8_) {
              to_erase = uVar3;
            }
            _begin_00.node = pbVar2;
            iVar8 = erase_from_leaf_node(this,_begin_00,to_erase);
            auVar1 = iVar8._0_12_;
          }
          pbVar2 = auVar1._0_8_;
          iVar4 = auVar1._8_4_;
        }
      }
    }
    __return_storage_ptr__->first = uVar7;
    (__return_storage_ptr__->second).node = pbVar2;
    (__return_storage_ptr__->second).position = iVar4;
    return __return_storage_ptr__;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xac4,
                "std::pair<size_type, iterator> phmap::priv::btree<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>>::erase(iterator, iterator) [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>]"
               );
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }